

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandwidth_estimator.c
# Opt level: O1

void WebRtcIsac_UpdateRateModel(RateModel *State,int StreamSize,int FrameSamples,double BottleNeck)

{
  int iVar1;
  double dVar2;
  double dVar3;
  
  State->InitCounter = 0;
  iVar1 = FrameSamples + 0xf;
  if (-1 < FrameSamples) {
    iVar1 = FrameSamples;
  }
  dVar3 = (((double)StreamSize * 8.0 * 1000.0) / BottleNeck + State->StillBuffered) -
          (double)(iVar1 >> 4);
  dVar2 = 0.0;
  if (0.0 <= dVar3) {
    dVar2 = dVar3;
  }
  State->StillBuffered = dVar2;
  return;
}

Assistant:

void WebRtcIsac_UpdateRateModel(
    RateModel *State,
    int StreamSize,                    /* bytes in bitstream */
    const int FrameSamples,            /* samples per frame */
    const double BottleNeck)        /* bottle neck rate; excl headers (bps) */
{
  double TransmissionTime;

  /* avoid the initial "high-rate" burst */
  State->InitCounter = 0;

  /* Update buffer delay */
  TransmissionTime = StreamSize * 8.0 * 1000.0 / BottleNeck;  /* ms */
  State->StillBuffered += TransmissionTime;
  State->StillBuffered -= (FrameSamples * 1000) / FS;     /* ms */
  if (State->StillBuffered < 0.0)
    State->StillBuffered = 0.0;

}